

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O3

JL_STATUS SkipWhiteSpace(ParseParameters *Params,char *pNextChar)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  char cVar7;
  
  uVar6 = Params->StringIndex;
  if (uVar6 < Params->JsonStringLength) {
    pcVar3 = Params->JsonString;
    bVar4 = 0;
    bVar5 = 0;
    do {
      cVar1 = pcVar3[uVar6 + 1];
      cVar7 = '\0';
      if (cVar1 != '\0') {
        cVar7 = pcVar3[uVar6 + 2];
      }
      cVar2 = pcVar3[uVar6];
      if ((bool)(bVar4 & cVar2 == '\n')) goto switchD_0011c315_caseD_9;
      if ((bool)(cVar1 != '/' | ~bVar5 | cVar2 != '*')) {
        if (!(bool)(bVar5 | bVar4)) {
          bVar5 = 0;
          switch(cVar2) {
          case '\t':
          case '\n':
          case '\r':
            break;
          case '\v':
          case '\f':
            if (Params->IsJson5 == false) goto LAB_0011c3c0;
LAB_0011c384:
            bVar5 = 0;
            break;
          default:
            bVar5 = 0;
            if (cVar2 != ' ') {
              if (cVar1 == -0x60 && (cVar2 == -0x3e && Params->IsJson5 == true)) {
                uVar6 = uVar6 + 1;
              }
              else {
                if (Params->IsJson5 == false) {
LAB_0011c3c0:
                  *pNextChar = cVar2;
                  return JL_STATUS_SUCCESS;
                }
                if (((cVar2 != -0x11) || (cVar1 != -0x45)) || (cVar7 != -0x41)) {
                  if (cVar2 == '/' && cVar1 == '/') {
                    bVar4 = 1;
                    goto LAB_0011c2db;
                  }
                  if ((cVar1 != '*') || (cVar2 != '/')) goto LAB_0011c3c0;
                  uVar6 = uVar6 + 1;
                  bVar5 = 1;
                  break;
                }
                uVar6 = uVar6 + 2;
              }
              goto LAB_0011c384;
            }
          }
switchD_0011c315_caseD_9:
          bVar4 = 0;
        }
      }
      else {
LAB_0011c2db:
        uVar6 = uVar6 + 1;
        bVar5 = 0;
      }
      uVar6 = uVar6 + 1;
      Params->StringIndex = uVar6;
    } while (uVar6 < Params->JsonStringLength);
  }
  return JL_STATUS_END_OF_DATA;
}

Assistant:

static
JL_STATUS
    SkipWhiteSpace
    (
        ParseParameters*    Params,
        char*               pNextChar
    )
{
    JL_STATUS jlStatus;
    bool inSingleLineComment = false;
    bool inMultiLineComment = false;

    jlStatus = JL_STATUS_END_OF_DATA;
    while( Params->StringIndex < Params->JsonStringLength )
    {
        char currentChar = Params->JsonString[Params->StringIndex];
        char nextChar = Params->JsonString[Params->StringIndex+1];
        char nextNextChar = 0 != nextChar ? Params->JsonString[Params->StringIndex+2] : 0;

        // See if currently in a comment and if this is the end of comment.
        if( inSingleLineComment && '\n' == currentChar )
        {
            inSingleLineComment = false;
        }
        else if( inMultiLineComment && '*' == currentChar && '/' == nextChar )
        {
            inMultiLineComment = false;
            Params->StringIndex  += 1;      // Skip the extra char (the '/')
        }
        else if( inSingleLineComment || inMultiLineComment )
        {
            // In comment, so ignore
        }
        else if(     ' '  == currentChar
            ||  '\n' == currentChar
            ||  '\r' == currentChar
            ||  '\t' == currentChar
            ||  ( '\v' == currentChar && Params->IsJson5 )
            ||  ( '\f' == currentChar && Params->IsJson5 ) )
        {
            // White space, so ignore
        }
        else if( Params->IsJson5 && '\xc2' == currentChar && '\xa0' == nextChar )
        {
            // Non-breaking space allowed by json5
            Params->StringIndex += 1;
        }
        else if(    Params->IsJson5
                 && (   ( '\xe2' == currentChar && '\x80' == nextChar && '\xa8' == nextNextChar )        // Line separator
                     || ( '\xe2' == currentChar && '\x80' == nextChar && '\xa9' == nextNextChar )        // Paragraph separator
                     || ( '\xef' == currentChar && '\xbb' == nextChar && '\xbf' == nextNextChar ) ) )    // Byte order mark
        {
            // Extra white space allowed by json5
            Params->StringIndex += 2;
        }
        else if( Params->IsJson5 && '/' == currentChar && '/' == nextChar )
        {
            inSingleLineComment = true;
            Params->StringIndex += 1;
        }
        else if( Params->IsJson5 && '/' == currentChar && '*' == nextChar )
        {
            inMultiLineComment = true;
            Params->StringIndex += 1;
        }
        else
        {
            // First non whitespace/comment
            *pNextChar = currentChar;
            jlStatus = JL_STATUS_SUCCESS;
            break;
        }

        Params->StringIndex += 1;
    }

    return jlStatus;
}